

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

string * __thiscall
glcts::ViewportArray::ProvokingVertex::getFragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,ProvokingVertex *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\nflat in  int gs_fs_color;\n     out int fs_out_color;\n\nvoid main()\n{\n    fs_out_color = gs_fs_color;\n}\n\n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

std::string ProvokingVertex::getFragmentShader()
{
	static const GLchar* source = "${VERSION}\n"
								  "\n"
								  "flat in  int gs_fs_color;\n"
								  "     out int fs_out_color;\n"
								  "\n"
								  "void main()\n"
								  "{\n"
								  "    fs_out_color = gs_fs_color;\n"
								  "}\n"
								  "\n";

	std::string result = source;

	return result;
}